

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.c
# Opt level: O2

LispPTR subr_gettime(LispPTR *args)

{
  uint uVar1;
  LispPTR *pLVar2;
  uint *puVar3;
  LispPTR LVar4;
  
  uVar1 = gettime((uint)(ushort)*args);
  if (args[1] == 0) {
    if ((uVar1 & 0xffff0000) == 0xffff0000) {
      LVar4 = uVar1 & 0xffff | 0xf0000;
    }
    else if ((uVar1 & 0xffff0000) == 0) {
      LVar4 = uVar1 | 0xe0000;
    }
    else {
      puVar3 = (uint *)createcell68k(2);
      *puVar3 = uVar1;
      if (((ulong)puVar3 & 1) != 0) {
        printf("Misaligned pointer in LAddrFromNative %p\n",puVar3);
      }
      LVar4 = (LispPTR)((ulong)((long)puVar3 - (long)Lisp_world) >> 1);
    }
  }
  else {
    pLVar2 = NativeAligned4FromLAddr(args[1]);
    *pLVar2 = uVar1;
    LVar4 = args[1];
  }
  return LVar4;
}

Assistant:

LispPTR subr_gettime(LispPTR args[])
{
  int result;
  result = gettime(args[0] & 0xffff);
  if (args[1]) {
    *((int *)NativeAligned4FromLAddr(args[1])) = result;
    return (args[1]);
  } else
    N_ARITH_SWITCH(result);
}